

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

sexp_conflict
sexp_bytes_to_string(sexp_conflict ctx,sexp_conflict vec,sexp_uint_t offset,sexp_uint_t size)

{
  sexp_conflict psVar1;
  
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(ctx,0x20,9);
  (psVar1->value).type.name = vec;
  (psVar1->value).string.offset = offset;
  (psVar1->value).type.slots = (sexp)(size - offset);
  return psVar1;
}

Assistant:

sexp sexp_bytes_to_string (sexp ctx, sexp vec, sexp_uint_t offset, sexp_uint_t size) {
  sexp res;
#if SEXP_USE_PACKED_STRINGS
  res = sexp_c_string(ctx, sexp_bytes_data(vec) + offset, size);
#else
  res = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(res) = vec;
  sexp_string_offset(res) = offset;
  sexp_string_size(res) = size - offset;
#endif
  return res;
}